

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O1

void __thiscall
testing::internal::StreamingListener::OnTestEnd(StreamingListener *this,TestInfo *test_info)

{
  bool bVar1;
  long *plVar2;
  undefined8 *puVar3;
  long *plVar4;
  ulong *puVar5;
  size_type *psVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  undefined8 uVar10;
  TimeInMillis local_f8;
  long *local_f0 [2];
  long local_e0 [2];
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  string local_90;
  ulong *local_70;
  long local_68;
  ulong local_60;
  long lStack_58;
  long *local_50;
  undefined8 local_48;
  long local_40;
  undefined8 uStack_38;
  
  bVar1 = TestResult::Skipped(&test_info->result_);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    bVar1 = TestResult::Failed(&test_info->result_);
    bVar1 = !bVar1;
  }
  pcVar8 = "0";
  if (bVar1) {
    pcVar8 = "1";
  }
  pcVar7 = "";
  if (bVar1) {
    pcVar7 = "";
  }
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,pcVar8,pcVar7);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_f0,0,(char *)0x0,0x13a1df);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_a0 = *plVar4;
    lStack_98 = plVar2[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar4;
    local_b0 = (long *)*plVar2;
  }
  local_a8 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b0);
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_60 = *puVar5;
    lStack_58 = plVar2[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *puVar5;
    local_70 = (ulong *)*plVar2;
  }
  local_68 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_f8 = (test_info->result_).elapsed_time_;
  StreamableToString<long>(&local_90,&local_f8);
  uVar9 = 0xf;
  if (local_70 != &local_60) {
    uVar9 = local_60;
  }
  if (uVar9 < local_90._M_string_length + local_68) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar10 = local_90.field_2._M_allocated_capacity;
    }
    if (local_90._M_string_length + local_68 <= (ulong)uVar10) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
      goto LAB_00129a3e;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
LAB_00129a3e:
  local_50 = &local_40;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_40 = *plVar2;
    uStack_38 = puVar3[3];
  }
  else {
    local_40 = *plVar2;
    local_50 = (long *)*puVar3;
  }
  local_48 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  psVar6 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_d0.field_2._M_allocated_capacity = *psVar6;
    local_d0.field_2._8_8_ = plVar2[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar6;
    local_d0._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_d0._M_string_length = plVar2[1];
  *plVar2 = (long)psVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  AbstractSocketWriter::SendLn
            ((this->socket_writer_)._M_t.
             super___uniq_ptr_impl<testing::internal::StreamingListener::AbstractSocketWriter,_std::default_delete<testing::internal::StreamingListener::AbstractSocketWriter>_>
             ._M_t.
             super__Tuple_impl<0UL,_testing::internal::StreamingListener::AbstractSocketWriter_*,_std::default_delete<testing::internal::StreamingListener::AbstractSocketWriter>_>
             .
             super__Head_base<0UL,_testing::internal::StreamingListener::AbstractSocketWriter_*,_false>
             ._M_head_impl,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  return;
}

Assistant:

void OnTestEnd(const TestInfo& test_info) override {
    SendLn("event=TestEnd&passed=" +
           FormatBool((test_info.result())->Passed()) + "&elapsed_time=" +
           StreamableToString((test_info.result())->elapsed_time()) + "ms");
  }